

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.c
# Opt level: O1

sysbvm_tuple_t
sysbvm_array_primitive_hash
          (sysbvm_context_t *context,sysbvm_tuple_t closure,size_t argumentCount,
          sysbvm_tuple_t *arguments)

{
  ulong *puVar1;
  sysbvm_object_tuple_t *object;
  ulong uVar2;
  size_t sVar3;
  ulong uVar4;
  ulong uVar5;
  
  if (argumentCount != 1) {
    sysbvm_error_argumentCountMismatch(1,argumentCount);
  }
  puVar1 = (ulong *)*arguments;
  uVar2 = (ulong)puVar1 & 0xf;
  if (uVar2 == 0 && puVar1 != (ulong *)0x0) {
    uVar5 = (ulong)(*(uint *)((long)puVar1 + 0xc) >> 3);
    uVar2 = *puVar1;
  }
  else {
    uVar5 = 0;
    if ((int)uVar2 == 0xf) {
      uVar2 = sysbvm_tuple_getImmediateTrivialTypeWithIndex(context,(ulong)puVar1 >> 4);
    }
    else {
      uVar2 = sysbvm_tuple_getImmediateTypeWithTag(context,uVar2);
    }
  }
  if ((uVar2 & 0xf) == 0 && uVar2 != 0) {
    uVar2 = (ulong)(*(uint *)(uVar2 + 8) >> 10);
  }
  else {
    uVar2 = uVar2 * 0x41c64e6d & 0x7ffffffffffffff;
  }
  if (uVar5 != 0) {
    uVar4 = 0;
    do {
      sVar3 = sysbvm_tuple_hash(context,*(sysbvm_tuple_t *)(*arguments + 0x10 + uVar4 * 8));
      uVar2 = uVar2 * 0x41c64e6d + sVar3 & 0x7ffffffffffffff;
      uVar4 = uVar4 + 1;
    } while (uVar5 != uVar4);
  }
  return uVar2 << 4 | 0xb;
}

Assistant:

static sysbvm_tuple_t sysbvm_array_primitive_hash(sysbvm_context_t *context, sysbvm_tuple_t closure, size_t argumentCount, sysbvm_tuple_t *arguments)
{
    (void)closure;
    if(argumentCount != 1) sysbvm_error_argumentCountMismatch(1, argumentCount);

    sysbvm_array_t **array = (sysbvm_array_t **)&arguments[0];
    size_t size = sysbvm_array_getSize((sysbvm_tuple_t)*array);

    size_t result = sysbvm_tuple_identityHash(sysbvm_tuple_getType(context, (sysbvm_tuple_t)*array));
    for(size_t i = 0; i < size; ++i)
        result = sysbvm_hashConcatenate(result, sysbvm_tuple_hash(context, (*array)->elements[i]));

    return sysbvm_tuple_size_encode(context, result);
}